

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,REF_INT keep,REF_INT lose)

{
  REF_NODE pRVar1;
  REF_ADJ ref_adj;
  uint uVar2;
  int local_ac;
  int local_8c;
  REF_INT local_88;
  REF_INT local_84;
  int local_80;
  REF_INT local_7c;
  long local_78;
  REF_INT local_64;
  int local_60;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT from_node;
  REF_GLOB global;
  REF_INT local;
  REF_INT item;
  REF_ADJ conn_adj;
  REF_NODE ref_node;
  REF_INT lose_local;
  REF_INT keep_local;
  REF_MIGRATE ref_migrate_local;
  
  pRVar1 = ref_migrate->grid->node;
  ref_adj = ref_migrate->conn;
  if (((keep < 0) || (pRVar1->max <= keep)) || (pRVar1->global[keep] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0xb6,
           "ref_migrate_2d_agglomeration_keep","keep node invalid");
    ref_migrate_local._4_4_ = 1;
  }
  else if (((lose < 0) || (pRVar1->max <= lose)) || (pRVar1->global[lose] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0xb7,
           "ref_migrate_2d_agglomeration_keep","lose node invalid");
    ref_migrate_local._4_4_ = 1;
  }
  else {
    ref_migrate->global[lose] = -1;
    if ((keep < 0) || (ref_migrate->parent_local->nnode <= keep)) {
      local_60 = -1;
    }
    else {
      local_60 = ref_migrate->parent_local->first[keep];
    }
    global._4_4_ = local_60;
    if (local_60 == -1) {
      local_64 = -1;
    }
    else {
      local_64 = ref_migrate->parent_local->item[local_60].ref;
    }
    global._0_4_ = local_64;
    while (global._4_4_ != -1) {
      if (((lose < 0) || (pRVar1->max <= lose)) || (pRVar1->global[lose] < 0)) {
        local_78 = -1;
      }
      else {
        local_78 = pRVar1->global[lose];
      }
      if (ref_migrate->global[(REF_INT)global] == local_78) {
        return 0;
      }
      global._4_4_ = ref_migrate->parent_local->item[global._4_4_].next;
      if (global._4_4_ == -1) {
        local_7c = -1;
      }
      else {
        local_7c = ref_migrate->parent_local->item[global._4_4_].ref;
      }
      global._0_4_ = local_7c;
    }
    if ((lose < 0) || (ref_adj->nnode <= lose)) {
      local_80 = -1;
    }
    else {
      local_80 = ref_adj->first[lose];
    }
    global._4_4_ = local_80;
    if (local_80 == -1) {
      local_84 = -1;
    }
    else {
      local_84 = ref_adj->item[local_80].ref;
    }
    ref_private_macro_code_rss_1 = local_84;
    while (global._4_4_ != -1) {
      uVar2 = ref_adj_remove(ref_adj,ref_private_macro_code_rss_1,lose);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0xc5,"ref_migrate_2d_agglomeration_keep",(ulong)uVar2,"rm to lose");
        return uVar2;
      }
      if (ref_private_macro_code_rss_1 != keep) {
        uVar2 = ref_adj_add_uniquely(ref_adj,ref_private_macro_code_rss_1,keep);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,199,"ref_migrate_2d_agglomeration_keep",(ulong)uVar2,"add to keep");
          return uVar2;
        }
        uVar2 = ref_adj_add_uniquely(ref_adj,keep,ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,200,"ref_migrate_2d_agglomeration_keep",(ulong)uVar2,"add to keep");
          return uVar2;
        }
      }
      global._4_4_ = ref_adj->item[global._4_4_].next;
      if (global._4_4_ == -1) {
        local_88 = -1;
      }
      else {
        local_88 = ref_adj->item[global._4_4_].ref;
      }
      ref_private_macro_code_rss_1 = local_88;
    }
    do {
      if ((lose < 0) || (ref_adj->nnode <= lose)) {
        local_8c = -1;
      }
      else {
        local_8c = ref_adj->first[lose];
      }
      if (local_8c == -1) {
        if (ref_migrate->global[keep] == -1) {
          return 0;
        }
        ref_migrate->xyz[keep * 3 + 1] = 0.5;
        ref_migrate->weight[keep] = 2.0;
        uVar2 = ref_adj_add(ref_migrate->parent_local,keep,lose);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xda,"ref_migrate_2d_agglomeration_keep",(ulong)uVar2,"add");
          return uVar2;
        }
        uVar2 = ref_adj_add(ref_migrate->parent_part,keep,pRVar1->part[lose]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xdd,"ref_migrate_2d_agglomeration_keep",(ulong)uVar2,"add");
          return uVar2;
        }
        return 0;
      }
      if ((lose < 0) || (ref_adj->nnode <= lose)) {
        local_ac = -1;
      }
      else {
        local_ac = ref_adj->first[lose];
      }
      ref_migrate_local._4_4_ = ref_adj_remove(ref_adj,lose,ref_adj->item[local_ac].ref);
    } while (ref_migrate_local._4_4_ == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0xd1,
           "ref_migrate_2d_agglomeration_keep",(ulong)ref_migrate_local._4_4_,"rm from lose");
  }
  return ref_migrate_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,
                                                     REF_INT keep,
                                                     REF_INT lose) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_ADJ conn_adj = ref_migrate_conn(ref_migrate);
  REF_INT item, local;
  REF_GLOB global;
  REF_INT from_node;

  /* not working for general agglomeration, ghost lose? */

  RAS(ref_node_valid(ref_node, keep), "keep node invalid");
  RAS(ref_node_valid(ref_node, lose), "lose node invalid");

  ref_migrate_global(ref_migrate, lose) = REF_EMPTY;

  /* skip if the lose node has been agglomerated */
  each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), keep,
                                  item, local) {
    global = ref_migrate_global(ref_migrate, local);
    if (global == ref_node_global(ref_node, lose)) {
      return REF_SUCCESS;
    }
  }
  /* update edges pointing to lose node */
  each_ref_adj_node_item_with_ref(conn_adj, lose, item, from_node) {
    RSS(ref_adj_remove(conn_adj, from_node, lose), "rm to lose");
    if (from_node != keep) {
      RSS(ref_adj_add_uniquely(conn_adj, from_node, keep), "add to keep");
      RSS(ref_adj_add_uniquely(conn_adj, keep, from_node), "add to keep");
    }
  }

  /* update edges pointing from lose node */
  while (ref_adj_valid(ref_adj_first(conn_adj, lose))) {
    RSS(ref_adj_remove(
            conn_adj, lose,
            ref_adj_item_ref(conn_adj, ref_adj_first(conn_adj, lose))),
        "rm from lose");
  }

  /* skip if keep node is off-proc or already agglomerated */
  if (!ref_migrate_valid(ref_migrate, keep)) return REF_SUCCESS;

  ref_migrate_xyz(ref_migrate, 1, keep) = 0.5;
  ref_migrate_weight(ref_migrate, keep) = 2.0;
  /* collect age in general case */
  RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), keep, lose), "add");
  RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), keep,
                  ref_node_part(ref_node, lose)),
      "add");

  return REF_SUCCESS;
}